

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O3

string * __thiscall
pbrt::FresnelConductor::ToString_abi_cxx11_(string *__return_storage_ptr__,FresnelConductor *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,"[ FresnelConductor eta: %s k: %s ]",(SampledSpectrum *)this,
             (SampledSpectrum *)(this + 0x10));
  return __return_storage_ptr__;
}

Assistant:

std::string FresnelConductor::ToString() const {
    return StringPrintf("[ FresnelConductor eta: %s k: %s ]", eta, k);
}